

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.cc
# Opt level: O2

ProtoElement * __thiscall
google::protobuf::util::converter::ProtoWriter::ProtoElement::pop(ProtoElement *this)

{
  ProtoWriter *this_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  reference pSVar4;
  undefined4 extraout_var;
  ProtoElement *pPVar5;
  _Base_ptr p_Var6;
  StringPiece local_40;
  
  if (this->proto3_ == false) {
    for (p_Var6 = (this->required_fields_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &(this->required_fields_)._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      this_00 = this->ow_;
      StringPiece::StringPiece<std::allocator<char>>
                (&local_40,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (*(long *)(p_Var6 + 1) + 0x28));
      MissingField(this_00,local_40);
    }
  }
  if (-1 < this->size_index_) {
    iVar1 = io::CodedOutputStream::ByteCount
                      ((this->ow_->stream_)._M_t.
                       super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
                       .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>.
                       _M_head_impl);
    pSVar4 = std::
             _Deque_iterator<google::protobuf::util::converter::ProtoWriter::SizeInfo,_google::protobuf::util::converter::ProtoWriter::SizeInfo_&,_google::protobuf::util::converter::ProtoWriter::SizeInfo_*>
             ::operator[](&(this->ow_->size_insert_).
                           super__Deque_base<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
                           ._M_impl.super__Deque_impl_data._M_start,(long)this->size_index_);
    pSVar4->size = pSVar4->size + iVar1;
    pSVar4 = std::
             _Deque_iterator<google::protobuf::util::converter::ProtoWriter::SizeInfo,_google::protobuf::util::converter::ProtoWriter::SizeInfo_&,_google::protobuf::util::converter::ProtoWriter::SizeInfo_*>
             ::operator[](&(this->ow_->size_insert_).
                           super__Deque_base<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
                           ._M_impl.super__Deque_impl_data._M_start,(long)this->size_index_);
    uVar2 = pSVar4->size | 1;
    iVar1 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    pPVar5 = this;
    while( true ) {
      iVar3 = (*(pPVar5->super_BaseElement)._vptr_BaseElement[2])(pPVar5);
      pPVar5 = (ProtoElement *)CONCAT44(extraout_var,iVar3);
      if (pPVar5 == (ProtoElement *)0x0) break;
      if (-1 < (long)pPVar5->size_index_) {
        pSVar4 = std::
                 _Deque_iterator<google::protobuf::util::converter::ProtoWriter::SizeInfo,_google::protobuf::util::converter::ProtoWriter::SizeInfo_&,_google::protobuf::util::converter::ProtoWriter::SizeInfo_*>
                 ::operator[](&(this->ow_->size_insert_).
                               super__Deque_base<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
                               ._M_impl.super__Deque_impl_data._M_start,(long)pPVar5->size_index_);
        pSVar4->size = pSVar4->size + (iVar1 * 9 + 0x49U >> 6);
      }
    }
  }
  pPVar5 = StructuredObjectWriter::BaseElement::
           pop<google::protobuf::util::converter::ProtoWriter::ProtoElement>
                     (&this->super_BaseElement);
  return pPVar5;
}

Assistant:

ProtoWriter::ProtoElement* ProtoWriter::ProtoElement::pop() {
  if (!proto3_) {
    // Calls the registered error listener for any required field(s) not yet
    // seen.
    for (std::set<const google::protobuf::Field*>::iterator it =
             required_fields_.begin();
         it != required_fields_.end(); ++it) {
      ow_->MissingField((*it)->name());
    }
  }
  // Computes the total number of proto bytes used by a message, also adjusts
  // the size of all parent messages by the length of this size field.
  // If size_index_ < 0, this is not a message, so no size field is added.
  if (size_index_ >= 0) {
    // Add the final buffer position to compute the total length of this
    // serialized message. The stored value (before this addition) already
    // contains the total length of the size fields of all nested messages
    // minus the initial buffer position.
    ow_->size_insert_[size_index_].size += ow_->stream_->ByteCount();
    // Calculate the length required to serialize the size field of the
    // message, and propagate this additional size information upward to
    // all enclosing messages.
    int size = ow_->size_insert_[size_index_].size;
    int length = CodedOutputStream::VarintSize32(size);
    for (ProtoElement* e = parent(); e != nullptr; e = e->parent()) {
      // Only nested messages have size field, lists do not have size field.
      if (e->size_index_ >= 0) {
        ow_->size_insert_[e->size_index_].size += length;
      }
    }
  }
  return BaseElement::pop<ProtoElement>();
}